

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall Bitmap::invert(Bitmap *this,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int *piVar2;
  int local_30;
  int local_2c;
  int x;
  int y;
  int local_20;
  int local_1c;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  Bitmap *this_local;
  
  y = 0;
  local_20 = y2;
  local_1c = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = this;
  piVar2 = std::max<int>(&y,&x2_local);
  x2_local = *piVar2;
  x = 0;
  piVar2 = std::max<int>(&x,&y2_local);
  y2_local = *piVar2;
  piVar2 = std::min<int>(&this->width,&local_1c);
  local_1c = *piVar2;
  piVar2 = std::min<int>(&this->height,&local_20);
  iVar1 = *piVar2;
  for (local_2c = y2_local; local_2c < iVar1; local_2c = local_2c + 1) {
    for (local_30 = x2_local; local_30 < local_1c; local_30 = local_30 + 1) {
      this->buffer[local_2c * this->width + local_30] =
           0xff - this->buffer[local_2c * this->width + local_30];
    }
  }
  return;
}

Assistant:

void
Bitmap::invert(int x1, int y1, int x2, int y2)
{
  x1 = std::max(0, x1);
  y1 = std::max(0, y1);

  x2 = std::min(width,  x2);
  y2 = std::min(height, y2);

  for(int y = y1; y < y2; ++y)
    for(int x = x1; x < x2; ++x)
    {
      buffer[y * width + x] = 255 - buffer[y * width + x];
    }
}